

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O3

uint32 acmod_set_has_attrib(acmod_set_t *acmod_set,acmod_id_t id,char *attrib)

{
  char **ppcVar1;
  int iVar2;
  ci_acmod_t *pcVar3;
  ulong uVar4;
  char *__s1;
  
  if (attrib != (char *)0x0) {
    if (id < acmod_set->n_ci) {
      pcVar3 = acmod_set->ci + id;
    }
    else {
      if (acmod_set->next_id <= id) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                ,0x33e,"Phone id %u is out of range.\n");
        return 0;
      }
      pcVar3 = (ci_acmod_t *)(acmod_set->multi + (id - acmod_set->n_ci));
    }
    ppcVar1 = pcVar3->attrib;
    if (ppcVar1 == (char **)0x0) {
      __assert_fail("attrib_list",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                    ,0x343,"uint32 acmod_set_has_attrib(acmod_set_t *, acmod_id_t, const char *)");
    }
    __s1 = *ppcVar1;
    if (__s1 != (char *)0x0) {
      uVar4 = 1;
      do {
        iVar2 = strcmp(__s1,attrib);
        if (iVar2 == 0) {
          return 1;
        }
        __s1 = ppcVar1[uVar4];
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (__s1 != (char *)0x0);
    }
  }
  return 0;
}

Assistant:

uint32
acmod_set_has_attrib(acmod_set_t *acmod_set,
		     acmod_id_t id,
		     const char *attrib)
{
    char **attrib_list;
    uint32 addr;
    uint32 i;

    if (attrib == NULL)
	return FALSE;

    if (id < acmod_set->n_ci) {
	attrib_list = acmod_set->ci[id].attrib;
    }
    else if (id < acmod_set->next_id) {
	addr = id - acmod_set->n_ci;

	attrib_list = acmod_set->multi[addr].attrib;
    }
    else {
	E_ERROR("Phone id %u is out of range.\n", id);

	return FALSE;
    }

    assert(attrib_list);

    for (i = 0; attrib_list[i]; i++) {
	if (strcmp(attrib_list[i], attrib) == 0)
	    return TRUE;
    }

    return FALSE;
}